

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

confirm * __thiscall lest::confirm::operator()(confirm *this,test *testing)

{
  _func_void_env_ptr *p_Var1;
  pointer pcVar2;
  undefined1 *local_68 [2];
  undefined1 local_58 [48];
  
  this->selected = this->selected + 1;
  p_Var1 = testing->behaviour;
  pcVar2 = (testing->name)._M_dataplus._M_p;
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,pcVar2,pcVar2 + (testing->name)._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->output).ctx);
  std::__cxx11::string::_M_assign((string *)&(this->output).testing);
  (*p_Var1)(&this->output);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  return this;
}

Assistant:

confirm & operator()( test testing )
    {
        try
        {
            ++selected; testing.behaviour( output( testing.name ) );
        }
        catch( message const & e )
        {
            ++failures; report( os, e, output.context() );
        }
        return *this;
    }